

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O2

void Am_Rich_Text_Initialize(void)

{
  uint *puVar1;
  Am_Rich_Text value;
  unsigned_short uVar2;
  Am_Object *pAVar3;
  Am_Object_Advanced obj_adv_viewer;
  Am_Demon_Set local_20;
  Am_Demon_Set demons;
  Am_Text_Viewing_Context local_10;
  
  Am_Object::Create(&obj_adv_viewer.super_Am_Object,(char *)&Am_Graphical_Object);
  Am_Object::operator=(&Am_Text_Viewer,&obj_adv_viewer.super_Am_Object);
  Am_Object::~Am_Object(&obj_adv_viewer.super_Am_Object);
  Am_Object::Am_Object(&obj_adv_viewer.super_Am_Object,&Am_Text_Viewer);
  Am_Object_Advanced::Get_Demons((Am_Object_Advanced *)&local_20);
  Am_Demon_Set::Copy(&demons);
  Am_Demon_Set::~Am_Demon_Set(&local_20);
  Am_Demon_Set::Set_Slot_Demon(&demons,2,rich_text_demon,4);
  Am_Object_Advanced::Set_Demons(&obj_adv_viewer,&demons);
  local_20.data = (Am_Demon_Set_Data *)Am_Object_Advanced::Get_Slot(&obj_adv_viewer,0x66);
  uVar2 = Am_Slot::Get_Demon_Bits((Am_Slot *)&local_20);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_20,uVar2 | 2);
  local_20.data = (Am_Demon_Set_Data *)Am_Object_Advanced::Get_Slot(&obj_adv_viewer,0xab);
  uVar2 = Am_Slot::Get_Demon_Bits((Am_Slot *)&local_20);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_20,uVar2 | 2);
  uVar2 = Am_Object_Advanced::Get_Demon_Mask(&obj_adv_viewer);
  Am_Object_Advanced::Set_Demon_Mask(&obj_adv_viewer,uVar2 | 2);
  pAVar3 = Am_Object::Set(&Am_Text_Viewer,0x65,0,0);
  pAVar3 = Am_Object::Set(pAVar3,100,0,0);
  pAVar3 = Am_Object::Set(pAVar3,0x66,200,0);
  pAVar3 = Am_Object::Set(pAVar3,0x67,200,0);
  pAVar3 = Am_Object::Set(pAVar3,2000,draw_rich_text.from_wrapper,0);
  value = Am_No_Rich_Text;
  if (Am_No_Rich_Text.data != (Am_Rich_Text_Data *)0x0) {
    puVar1 = &((Am_No_Rich_Text.data)->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  pAVar3 = Am_Object::Add(pAVar3,0xab,&(value.data)->super_Am_Wrapper,0);
  Am_Text_Viewing_Context::Am_Text_Viewing_Context(&local_10);
  if (local_10.data != (Am_Text_Viewing_Context_Data *)0x0) {
    puVar1 = &((local_10.data)->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  Am_Object::Add(pAVar3,0x1ee,&(local_10.data)->super_Am_Wrapper,0);
  Am_Text_Viewing_Context::~Am_Text_Viewing_Context(&local_10);
  Am_Demon_Set::~Am_Demon_Set(&demons);
  Am_Object::~Am_Object(&obj_adv_viewer.super_Am_Object);
  return;
}

Assistant:

void
Am_Rich_Text_Initialize()
{
#ifdef DEBUG
  Am_Register_Slot_Key(Am_TEXT_VIEWER, "~TEXT_VIEWER~");
#endif

  Am_Text_Viewer = Am_Graphical_Object.Create(DSTR("Rich_Text_Viewer"));

  // Installing the demon procedure Rich_text_demon for Am_TEXT and Am_WIDTH

  // Get the advanced object of Am_Text_Viewer
  Am_Object_Advanced obj_adv_viewer = (Am_Object_Advanced &)Am_Text_Viewer;

  // Make a copy of the inherited demon set.
  Am_Demon_Set demons(obj_adv_viewer.Get_Demons().Copy());

  // Add the Rich_text_demon to the demon set using Rich_text_demon_bit
  demons.Set_Slot_Demon(rich_text_demon_bit, rich_text_demon,
                        Am_DEMON_ON_CHANGE | Am_DEMON_PER_SLOT);

  // Put the modified demon set back into the Am_Text_Viewer
  obj_adv_viewer.Set_Demons(demons);

  // Add the Rich_text_demon_bit to the demon bits of the
  // Am_WIDTH and Am_TEXT slots
  Am_Slot slot;
  unsigned short prev_bits;

  slot = obj_adv_viewer.Get_Slot(Am_WIDTH);
  prev_bits = slot.Get_Demon_Bits();
  slot.Set_Demon_Bits(rich_text_demon_bit | prev_bits);

  slot = obj_adv_viewer.Get_Slot(Am_TEXT);
  prev_bits = slot.Get_Demon_Bits();
  slot.Set_Demon_Bits(rich_text_demon_bit | prev_bits);

  // Set the demon mask
  unsigned short mask = obj_adv_viewer.Get_Demon_Mask();
  mask |= rich_text_demon_bit;
  obj_adv_viewer.Set_Demon_Mask(mask);

  // Set the initial values now that the demon procedures are installed
  Am_Text_Viewer.Set(Am_TOP, 0)
      .Set(Am_LEFT, 0)
      .Set(Am_WIDTH, 200)
      .Set(Am_HEIGHT, 200)
      .Set(Am_DRAW_METHOD, draw_rich_text)
      .Add(Am_TEXT, Am_No_Rich_Text) // should be a Am_Rich_Text object
      .Add(Am_TEXT_VIEWER, Am_Text_Viewing_Context());
}